

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O3

char * __thiscall Fl_Input_::expand(Fl_Input_ *this,char *p,char *buf)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  byte *pbVar10;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  double extraout_XMM0_Qa;
  int local_4c;
  byte *local_48;
  byte *local_40;
  
  if (((this->super_Fl_Widget).type_ & 7) == 5) {
    lVar9 = 0;
    pbVar12 = (byte *)buf;
    pbVar13 = (byte *)p;
    do {
      if (this->value_ + this->size_ <= pbVar13) break;
      iVar3 = fl_utf8len(*pbVar13);
      if (0 < iVar3) {
        l_secret = fl_utf8encode(0x2a,(char *)pbVar12);
        lVar9 = lVar9 + l_secret;
      }
      pbVar13 = pbVar13 + 1;
      pbVar12 = (byte *)(buf + lVar9);
    } while (lVar9 < 0x3fc);
  }
  else {
    iVar3 = 0;
    local_4c = 0;
    lVar9 = 0;
    pbVar10 = (byte *)buf;
    local_48 = (byte *)buf;
    local_40 = (byte *)p;
    do {
      pbVar2 = local_48;
      pbVar12 = local_40;
      if ((((this->super_Fl_Widget).type_ & 0x10) != 0) &&
         ((this->value_ + this->size_ <= p || (iVar4 = isspace((uint)(byte)*p), iVar4 != 0)))) {
        iVar4 = (this->super_Fl_Widget).w_;
        iVar5 = Fl::box_dw((uint)(this->super_Fl_Widget).box_);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
                  (fl_graphics_driver,local_48,(ulong)(uint)((int)pbVar10 - (int)local_48));
        local_4c = local_4c + (int)extraout_XMM0_Qa;
        pbVar2 = pbVar10;
        pbVar12 = (byte *)p;
        if (local_40 + 1 < p) {
          if ((iVar3 != 0) &&
             (pbVar12 = local_48, pbVar13 = local_40, (iVar4 - iVar5) + -2 < local_4c)) break;
          iVar3 = iVar3 + 1;
          pbVar12 = (byte *)p;
        }
      }
      local_40 = pbVar12;
      local_48 = pbVar2;
      pbVar12 = pbVar10;
      pbVar13 = (byte *)p;
      if (this->value_ + this->size_ <= p) break;
      bVar1 = *p;
      if (bVar1 < 0x20 || bVar1 == 0x7f) {
        if (bVar1 == 9) {
          if (((this->super_Fl_Widget).type_ & 7) == 4) {
            uVar6 = fl_utf_nb_char((uchar *)buf,(int)lVar9);
            uVar7 = uVar6 + 7;
            if (-1 < (int)uVar6) {
              uVar7 = uVar6;
            }
            uVar8 = (ulong)(((uVar7 & 0xfffffff8) - uVar6) + 7);
            uVar11 = 0x3fbU - lVar9;
            if (uVar8 <= 0x3fbU - lVar9) {
              uVar11 = uVar8;
            }
            memset(buf + lVar9,0x20,uVar11 + 1);
            lVar9 = lVar9 + uVar11 + 1;
            goto LAB_001ba413;
          }
        }
        else if ((bVar1 == 10) && (((this->super_Fl_Widget).type_ & 7) == 4)) {
          pbVar12 = (byte *)(buf + lVar9);
          break;
        }
        *pbVar10 = 0x5e;
        lVar9 = lVar9 + 2;
        pbVar10[1] = bVar1 ^ 0x40;
      }
      else {
        lVar9 = lVar9 + 1;
        *pbVar10 = bVar1;
      }
LAB_001ba413:
      p = (char *)((byte *)p + 1);
      pbVar10 = (byte *)(buf + lVar9);
      pbVar12 = pbVar10;
      pbVar13 = (byte *)p;
    } while (lVar9 < 0x3fc);
  }
  *pbVar12 = 0;
  return (char *)pbVar13;
}

Assistant:

const char* Fl_Input_::expand(const char* p, char* buf) const {
  char* o = buf;
  char* e = buf+(MAXBUF-4);
  const char* lastspace = p;
  char* lastspace_out = o;
  int width_to_lastspace = 0;
  int word_count = 0;
  int word_wrap;
//  const char *pe = p + strlen(p);

  if (input_type()==FL_SECRET_INPUT) {
    while (o<e && p < value_+size_) {
      if (fl_utf8len((char)p[0]) >= 1) {
	l_secret = fl_utf8encode(secret_char, o);
	o += l_secret;
      }
      p++;
    }

  } else while (o<e) {
    if (wrap() && (p >= value_+size_ || isspace(*p & 255))) {
      word_wrap = w() - Fl::box_dw(box()) - 2;
      width_to_lastspace += (int)fl_width(lastspace_out, (int) (o-lastspace_out));
      if (p > lastspace+1) {
	if (word_count && width_to_lastspace > word_wrap) {
	  p = lastspace; o = lastspace_out; break;
	}
	word_count++;
      }
      lastspace = p;
      lastspace_out = o;
    }

    if (p >= value_+size_) break;
    int c = *p++ & 255;
    if (c < ' ' || c == 127) {
      if (c=='\n' && input_type()==FL_MULTILINE_INPUT) {p--; break;}
      if (c == '\t' && input_type()==FL_MULTILINE_INPUT) {
        for (c = fl_utf_nb_char((uchar*)buf, (int) (o-buf))%8; c<8 && o<e; c++) {
          *o++ = ' ';
        }
      } else {
	*o++ = '^';
	*o++ = c ^ 0x40;
      }
    } else {
      *o++ = c;
    }
  }
  *o = 0;
  return p;
}